

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::mouse2_dragged(Application *this,float x,float y)

{
  Application *in_RDI;
  float dy;
  float dx;
  double in_stack_00000048;
  double in_stack_00000050;
  double in_stack_00000058;
  Camera *in_stack_00000060;
  
  if ((*(int *)&(in_RDI->super_Renderer).field_0xc != 1) &&
     ((*(int *)&(in_RDI->super_Renderer).field_0xc != 2 || (in_RDI->action != IK)))) {
    Camera::move_by(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
    updateWidgets(in_RDI);
  }
  return;
}

Assistant:

void Application::mouse2_dragged(float x, float y) {
  if (mode == RENDER_MODE) return;
  if (mode == ANIMATE_MODE && action == Action::IK) return;
  float dx = (x - mouseX);
  float dy = (y - mouseY);
  // don't negate y because up is down.
  camera.move_by(-dx, dy, canonical_view_distance);

  updateWidgets();
}